

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

bool CheckShader(GLuint handle,char *desc)

{
  undefined1 uVar1;
  undefined1 extraout_AL;
  int iVar2;
  ImGuiContext *pIVar3;
  ImGuiIO *pIVar4;
  void *pvVar5;
  uint uVar6;
  size_t size;
  GLint log_length;
  ImVector<char> buf;
  GLint status;
  uint local_4c;
  undefined8 local_48;
  void *pvStack_40;
  undefined4 local_34;
  
  pIVar3 = ImGui::GetCurrentContext();
  if (pIVar3 == (ImGuiContext *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pIVar4 = ImGui::GetIO();
    pvVar5 = pIVar4->BackendRendererUserData;
  }
  local_34 = 0;
  local_4c = 0;
  (*imgl3wProcs.ptr[0x24])(handle,0x8b81,&local_34);
  uVar1 = (*imgl3wProcs.ptr[0x24])(handle,0x8b84,&local_4c);
  if ((char)local_34 == '\0') {
    iVar2 = fprintf(_stderr,
                    "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n"
                    ,desc,(long)pvVar5 + 4);
    uVar1 = (undefined1)iVar2;
  }
  if (1 < (int)local_4c) {
    uVar6 = local_4c + 1;
    local_48 = 0;
    pvStack_40 = (void *)0x0;
    size = 8;
    if (8 < uVar6) {
      size = (size_t)uVar6;
    }
    pvVar5 = ImGui::MemAlloc(size);
    local_48 = CONCAT44((int)size,uVar6);
    pvStack_40 = pvVar5;
    (*imgl3wProcs.ptr[0x23])(handle,(ulong)local_4c,0,pvVar5);
    iVar2 = fprintf(_stderr,"%s\n",pvVar5);
    uVar1 = (undefined1)iVar2;
    if (pvVar5 != (void *)0x0) {
      ImGui::MemFree(pvVar5);
      uVar1 = extraout_AL;
    }
  }
  return (bool)uVar1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s! With GLSL: %s\n", desc, bd->GlslVersionString);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}